

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O0

Index IndexTools::IndividualToJointIndicesArrayStepSize
                (Index *indices,vector<unsigned_long,_std::allocator<unsigned_long>_> *step_size,
                size_t vec_size)

{
  int iVar1;
  const_reference pvVar2;
  ulong in_RDX;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  long in_RDI;
  Index i;
  Index jointI;
  undefined4 local_20;
  undefined4 local_1c;
  
  local_1c = 0;
  for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 1) {
    iVar1 = *(int *)(in_RDI + (ulong)local_20 * 4);
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (in_RSI,(ulong)local_20);
    local_1c = local_1c + iVar1 * (int)*pvVar2;
  }
  return local_1c;
}

Assistant:

Index IndexTools::IndividualToJointIndicesArrayStepSize(const Index* indices,
        const vector<size_t> &step_size, size_t vec_size) 
{
    Index jointI = 0;
    for(Index i=0; i < vec_size ; i++)            
        jointI += indices[i] * step_size[i];
    return(jointI);
}